

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_8::DiskHandle::write(DiskHandle *this,int __fd,void *__buf,size_t __n)

{
  char *start;
  int osErrorNumber;
  size_t sVar1;
  void *pvVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  DiskHandle *local_88;
  uchar *local_80;
  Fault local_78;
  Fault f_1;
  Fault local_60;
  Fault f;
  SyscallResult local_34;
  undefined1 auStack_30 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  uint64_t offset_local;
  DiskHandle *this_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  this_local = (DiskHandle *)__buf;
  data_local.ptr = (uchar *)__n;
  while( true ) {
    sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    if (sVar1 == 0) {
      return 0;
    }
    f.exception = (Exception *)auStack_30;
    local_34 = _::Debug::
               syscall<kj::(anonymous_namespace)::DiskHandle::write(unsigned_long,kj::ArrayPtr<unsigned_char_const>)const::_lambda()_1_>
                         ((anon_class_32_4_7cf98988 *)&f,false);
    pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_34);
    start = _auStack_30;
    if (pvVar2 == (void *)0x0) break;
    if ((long)_auStack_30 < 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x179,FAILED,"n > 0","\"pwrite() returned zero?\"",
                 (char (*) [24])"pwrite() returned zero?");
      _::Debug::Fault::fatal(&local_78);
    }
    sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    AVar3 = ArrayPtr<const_unsigned_char>::slice
                      ((ArrayPtr<const_unsigned_char> *)&this_local,(size_t)start,sVar1);
    local_88 = (DiskHandle *)AVar3.ptr;
    this_local = local_88;
    local_80 = (uchar *)AVar3.size_;
    data_local.ptr = local_80;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_34);
  _::Debug::Fault::Fault
            (&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x178,osErrorNumber,"n = pwrite(fd, data.begin(), data.size(), offset)","");
  _::Debug::Fault::fatal(&local_60);
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const {
    // pwrite() probably never returns short writes unless there's no space left on disk.
    // Unfortunately, though, per spec we are not allowed to assume this.

    while (data.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pwrite(fd, data.begin(), data.size(), offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");
      offset += n;
      data = data.slice(n, data.size());
    }
  }